

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

string * __thiscall
Catch::Matchers::Impl::
MatchNotOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
describe(MatchNotOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *this)

{
  string *in_RDI;
  string *__rhs;
  string *__lhs;
  string local_30 [8];
  MatcherUntypedBase *in_stack_ffffffffffffffd8;
  
  __lhs = local_30;
  __rhs = in_RDI;
  MatcherUntypedBase::toString_abi_cxx11_(in_stack_ffffffffffffffd8);
  std::operator+((char *)__lhs,__rhs);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

std::string describe() const override {
                return "not " + m_underlyingMatcher.toString();
            }